

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O1

void __thiscall RedBlackTree::merge(RedBlackTree *this,RedBlackTree *RedBlackTree2)

{
  int iVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *node_00;
  RedBlackTree *ptr;
  RedBlackTree *ptr_00;
  Node *pNVar4;
  Node *pNVar5;
  int iVar6;
  int data;
  Node *c;
  Node *node;
  RedBlackTree local_48;
  Node *local_40;
  int local_34;
  
  ptr = &local_48;
  ptr_00 = &local_48;
  pNVar5 = this->root;
  pNVar3 = RedBlackTree2->root;
  iVar1 = 0;
  iVar6 = 0;
  if (pNVar5 != (Node *)0x0) {
    iVar6 = 0;
    pNVar2 = pNVar5;
    do {
      iVar6 = iVar6 + (uint)(pNVar2->color == 1);
      pNVar2 = pNVar2->left;
    } while (pNVar2 != (Node *)0x0);
  }
  if (pNVar3 != (Node *)0x0) {
    iVar1 = 0;
    pNVar2 = pNVar3;
    do {
      iVar1 = iVar1 + (uint)(pNVar2->color == 1);
      pNVar2 = pNVar2->left;
    } while (pNVar2 != (Node *)0x0);
  }
  if (iVar1 < iVar6) {
    do {
      local_48.root = pNVar5;
      pNVar5 = (local_48.root)->right;
    } while ((local_48.root)->right != (Node *)0x0);
LAB_00106630:
    data = (local_48.root)->value;
    local_40 = deleteBST(this,&this->root,data);
    node_00 = (Node *)&local_40;
    fixDelete(this,(Node **)node_00);
    pNVar5 = this->root;
  }
  else if (iVar6 < iVar1) {
    do {
      local_48.root = pNVar3;
      pNVar3 = (local_48.root)->left;
    } while ((local_48.root)->left != (Node *)0x0);
    data = (local_48.root)->value;
    local_40 = deleteBST(RedBlackTree2,&RedBlackTree2->root,data);
    node_00 = (Node *)&local_40;
    fixDelete(RedBlackTree2,(Node **)node_00);
    pNVar3 = RedBlackTree2->root;
  }
  else {
    do {
      pNVar2 = pNVar3;
      pNVar3 = pNVar2->left;
    } while (pNVar2->left != (Node *)0x0);
    local_34 = pNVar2->value;
    local_48.root = pNVar2;
    local_40 = deleteBST(RedBlackTree2,&RedBlackTree2->root,local_34);
    node_00 = (Node *)&local_40;
    fixDelete(RedBlackTree2,(Node **)node_00);
    iVar1 = 0;
    pNVar3 = RedBlackTree2->root;
    for (pNVar4 = pNVar3; pNVar4 != (Node *)0x0; pNVar4 = pNVar4->left) {
      iVar1 = iVar1 + (uint)(pNVar4->color == 1);
    }
    data = local_34;
    if (iVar6 != iVar1) {
      insertElement(RedBlackTree2,pNVar2->value);
      pNVar3 = RedBlackTree2->root;
      do {
        local_48.root = pNVar5;
        pNVar5 = (local_48.root)->right;
      } while ((local_48.root)->right != (Node *)0x0);
      goto LAB_00106630;
    }
  }
  if (local_48.root != (Node *)0x0) {
    (local_48.root)->color = 0;
  }
  iVar6 = 0;
  iVar1 = 0;
  if (pNVar5 != (Node *)0x0) {
    iVar1 = 0;
    node_00 = pNVar5;
    do {
      iVar1 = iVar1 + (uint)(node_00->color == 1);
      node_00 = node_00->left;
    } while (node_00 != (Node *)0x0);
  }
  if (pNVar3 != (Node *)0x0) {
    iVar6 = 0;
    node_00 = pNVar3;
    do {
      iVar6 = iVar6 + (uint)(node_00->color == 1);
      node_00 = node_00->left;
    } while (node_00 != (Node *)0x0);
  }
  if (iVar1 == iVar6) {
    (local_48.root)->left = pNVar5;
    pNVar5->parent = local_48.root;
    (local_48.root)->right = pNVar3;
    pNVar3->parent = local_48.root;
    if (local_48.root != (Node *)0x0) {
      (local_48.root)->color = 1;
    }
    (local_48.root)->value = data;
    this->root = (Node *)local_48;
    return;
  }
  local_40 = pNVar5;
  pNVar2 = pNVar3;
  if (iVar6 <= iVar1) {
    while( true ) {
      iVar1 = 0;
      for (pNVar2 = local_40; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->left) {
        iVar1 = iVar1 + (uint)(pNVar2->color == 1);
      }
      if (iVar6 == iVar1) break;
      local_40 = local_40->right;
    }
    pNVar2 = local_40->parent;
    (local_48.root)->right = pNVar3;
    pNVar3->parent = local_48.root;
    (local_48.root)->left = local_40;
    local_40->parent = local_48.root;
    pNVar2->right = local_48.root;
    (local_48.root)->parent = pNVar2;
    if ((pNVar2 == (Node *)0x0) || (pNVar2->color != 0)) {
      if ((local_40 == (Node *)0x0) || (local_40->color != 0)) goto LAB_001068ae;
      ptr_00 = (RedBlackTree *)&local_40;
    }
    fixInsert(this,&ptr_00->root);
LAB_001068ae:
    (local_48.root)->value = data;
    this->root = pNVar5;
    return;
  }
  while( true ) {
    if (pNVar2 == (Node *)0x0) {
      iVar6 = 0;
    }
    else {
      iVar6 = 0;
      pNVar4 = pNVar2;
      do {
        iVar6 = iVar6 + (uint)(pNVar4->color == 1);
        pNVar4 = pNVar4->left;
      } while (pNVar4 != (Node *)0x0);
    }
    if (iVar1 == iVar6) break;
    node_00 = pNVar2;
    pNVar2 = pNVar2->left;
  }
  if (pNVar2 != (Node *)0x0) {
    node_00 = pNVar2->parent;
  }
  (local_48.root)->left = pNVar5;
  if (pNVar5 != (Node *)0x0) {
    pNVar5->parent = local_48.root;
  }
  (local_48.root)->right = pNVar2;
  if (pNVar2 != (Node *)0x0) {
    pNVar2->parent = local_48.root;
  }
  node_00->left = local_48.root;
  (local_48.root)->parent = node_00;
  if ((node_00 == (Node *)0x0) || (node_00->color != 0)) {
    if ((pNVar2 == (Node *)0x0) || (pNVar2->color != 0)) goto LAB_00106897;
    ptr = (RedBlackTree *)&local_40;
  }
  local_40 = pNVar2;
  fixInsert(this,&ptr->root);
LAB_00106897:
  (local_48.root)->value = data;
  this->root = pNVar3;
  return;
}

Assistant:

void RedBlackTree::merge(RedBlackTree RedBlackTree2) {
    int temp;
    Node *c, *temp_ptr;
    Node *root1 = root;
    Node *root2 = RedBlackTree2.root;

    int initialblackheight1 = getBlackHeight(root1);
    int initialblackheight2 = getBlackHeight(root2);
    if (initialblackheight1 > initialblackheight2) {
        c = findMax(root1);
        temp = c->value;
        removeElement(c->value);
        root1 = root;
    } else if (initialblackheight2 > initialblackheight1) {
        c = findMin(root2);
        temp = c->value;
        RedBlackTree2.removeElement(c->value);
        root2 = RedBlackTree2.root;
    } else {
        c = findMin(root2);
        temp = c->value;
        RedBlackTree2.removeElement(c->value);
        root2 = RedBlackTree2.root;
        if (initialblackheight1 != getBlackHeight(root2)) {
            RedBlackTree2.insertElement(c->value);
            root2 = RedBlackTree2.root;
            c = findMax(root1);
            temp = c->value;
            removeElement(c->value);
            root1 = root;
        }
    }
    setColor(c, RED);

    int finalblackheight1 = getBlackHeight(root1);
    int finalblackheight2 = getBlackHeight(root2);
    if (finalblackheight1 == finalblackheight2) {
        c->left = root1;
        root1->parent = c;
        c->right = root2;
        root2->parent = c;
        setColor(c, BLACK);
        c->value = temp;
        root = c;
    } else if (finalblackheight2 > finalblackheight1) {
        Node *ptr = root2;
        while (finalblackheight1 != getBlackHeight(ptr)) {
            temp_ptr = ptr;
            ptr = ptr->left;
        }
        Node *ptr_parent;
        if (ptr == nullptr) {
            ptr_parent = temp_ptr;
        } else {
            ptr_parent = ptr->parent;
        }
        c->left = root1;
        if (root1 != nullptr) {
            root1->parent = c;
        }
        c->right = ptr;
        if (ptr != nullptr) {
            ptr->parent = c;
        }
        ptr_parent->left = c;
        c->parent = ptr_parent;
        if (getColor(ptr_parent) == RED) {
            {
                fixInsert(c);
            }
        } else if (getColor(ptr) == RED) {
            fixInsert(ptr);
        }
        c->value = temp;
        root = root2;
    } else {
        Node *ptr = root1;
        while (finalblackheight2 != getBlackHeight(ptr)) {
            ptr = ptr->right;
        }
        Node *ptr_parent = ptr->parent;
        c->right = root2;
        root2->parent = c;
        c->left = ptr;
        ptr->parent = c;
        ptr_parent->right = c;
        c->parent = ptr_parent;
        if (getColor(ptr_parent) == RED) {
            fixInsert(c);
        } else if (getColor(ptr) == RED) {
            fixInsert(ptr);
        }
        c->value = temp;
        root = root1;
    }
}